

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

map<pstore::uint128,_pstore::address,_std::greater<pstore::uint128>,_std::allocator<std::pair<const_pstore::uint128,_pstore::address>_>_>
* __thiscall
(anonymous_namespace)::
generate_ordered_map<std::map<pstore::uint128,pstore::address,std::greater<pstore::uint128>,std::allocator<std::pair<pstore::uint128_const,pstore::address>>>>
          (map<pstore::uint128,_pstore::address,_std::greater<pstore::uint128>,_std::allocator<std::pair<const_pstore::uint128,_pstore::address>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,size_t num_keys,size_t step)

{
  unsigned_long v_00;
  mapped_type *pmVar1;
  uint64_t high;
  address aVar2;
  bool bVar3;
  undefined1 local_78 [8];
  digest key;
  uint64_t v;
  uint128 local_48;
  value_type local_30;
  undefined1 local_21;
  size_t local_20;
  size_t step_local;
  size_t num_keys_local;
  map<pstore::uint128,_pstore::address,_std::greater<pstore::uint128>,_std::allocator<std::pair<const_pstore::uint128,_pstore::address>_>_>
  *map;
  
  local_21 = 0;
  local_20 = num_keys;
  step_local = (size_t)this;
  num_keys_local = (size_t)__return_storage_ptr__;
  std::
  map<pstore::uint128,_pstore::address,_std::greater<pstore::uint128>,_std::allocator<std::pair<const_pstore::uint128,_pstore::address>_>_>
  ::map(__return_storage_ptr__);
  local_30 = (value_type)pstore::address::null();
  v_00 = std::numeric_limits<unsigned_long>::max();
  pstore::uint128::uint128<unsigned_long,void>(&local_48,v_00);
  pmVar1 = std::
           map<pstore::uint128,_pstore::address,_std::greater<pstore::uint128>,_std::allocator<std::pair<const_pstore::uint128,_pstore::address>_>_>
           ::operator[](__return_storage_ptr__,&local_48);
  pmVar1->a_ = local_30;
  do {
    high = local_20 * step_local - step_local;
    pstore::uint128::uint128((uint128 *)local_78,high,high);
    aVar2 = pstore::address::null();
    pmVar1 = std::
             map<pstore::uint128,_pstore::address,_std::greater<pstore::uint128>,_std::allocator<std::pair<const_pstore::uint128,_pstore::address>_>_>
             ::operator[](__return_storage_ptr__,(uint128 *)local_78);
    pmVar1->a_ = aVar2.a_;
    bVar3 = step_local != 0;
    step_local = step_local - 1;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

Map generate_ordered_map (std::size_t num_keys, std::size_t const step) {
        Map map;
        map[std::numeric_limits<std::uint64_t>::max ()] = pstore::address::null ();
        do {
            std::uint64_t v = step * num_keys - num_keys;
            auto const key = pstore::index::digest{v, v};
            map[key] = pstore::address::null ();
        } while (num_keys--);
        return map;
    }